

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_hashmap_in_array(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pNeedle_00;
  int iVar1;
  int local_34;
  int rc;
  int bStrict;
  jx9_value *pNeedle;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (nArg < 2) {
    jx9_result_bool(pCtx,0);
  }
  else {
    pNeedle_00 = *apArg;
    local_34 = 0;
    if (2 < nArg) {
      local_34 = jx9_value_to_bool(apArg[2]);
    }
    iVar1 = jx9_value_is_json_array(apArg[1]);
    if (iVar1 == 0) {
      iVar1 = jx9_value_compare(pNeedle_00,apArg[1],local_34);
      jx9_result_bool(pCtx,(uint)(iVar1 == 0));
    }
    else {
      iVar1 = HashmapFindValue((jx9_hashmap *)(apArg[1]->x).pOther,pNeedle_00,
                               (jx9_hashmap_node **)0x0,local_34);
      jx9_result_bool(pCtx,(uint)(iVar1 == 0));
    }
  }
  return 0;
}

Assistant:

static int jx9_hashmap_in_array(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pNeedle;
	int bStrict;
	int rc;
	if( nArg < 2 ){
		/* Missing argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pNeedle = apArg[0];
	bStrict = 0;
	if( nArg > 2 ){
		bStrict = jx9_value_to_bool(apArg[2]);
	}
	if( !jx9_value_is_json_array(apArg[1]) ){
		/* haystack must be an array, perform a standard comparison */ 
		rc = jx9_value_compare(pNeedle, apArg[1], bStrict);
		/* Set the comparison result */
		jx9_result_bool(pCtx, rc == 0);
		return JX9_OK;
	}
	/* Perform the lookup */
	rc = HashmapFindValue((jx9_hashmap *)apArg[1]->x.pOther, pNeedle, 0, bStrict);
	/* Lookup result */
	jx9_result_bool(pCtx, rc == SXRET_OK);
	return JX9_OK;
}